

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O1

void create_secret_door(level *lev,mkroom *croom,xchar walls)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  char cVar4;
  int iVar5;
  char x;
  
  iVar5 = 100;
  do {
    cVar4 = croom->hx;
    cVar1 = croom->lx;
    uVar2 = mt_random();
    x = SUB161(ZEXT416(uVar2) % SEXT816(((long)cVar4 - (long)cVar1) + 1),0) + croom->lx;
    cVar4 = croom->hy;
    cVar1 = croom->ly;
    uVar2 = mt_random();
    cVar4 = SUB161(ZEXT416(uVar2) % SEXT816(((long)cVar4 - (long)cVar1) + 1),0) + croom->ly;
    uVar2 = mt_random();
    switch(uVar2 & 3) {
    case 0:
      if ((walls & 1U) != 0) {
        cVar4 = croom->ly + -1;
LAB_0024a22b:
        iVar3 = okdoor(lev,x,cVar4);
        if (iVar3 != 0) {
          lev->locations[x][cVar4].typ = '\x0f';
          *(uint *)&lev->locations[x][cVar4].field_0x6 =
               *(uint *)&lev->locations[x][cVar4].field_0x6 & 0xfffffe0f | 0x40;
          add_door(lev,(int)x,(int)cVar4,croom);
          return;
        }
      }
      break;
    case 1:
      if ((walls & 2U) != 0) {
        cVar4 = croom->hy + '\x01';
        goto LAB_0024a22b;
      }
      break;
    case 2:
      if ((walls & 4U) != 0) {
        x = croom->lx + -1;
        goto LAB_0024a22b;
      }
      break;
    case 3:
      if ((walls & 8U) != 0) {
        x = croom->hx + '\x01';
        goto LAB_0024a22b;
      }
    }
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      impossible("couldn\'t create secret door on any walls 0x%x",(ulong)(uint)(int)walls);
      return;
    }
  } while( true );
}

Assistant:

void create_secret_door(struct level *lev,
			struct mkroom *croom,
			xchar walls) /* any of W_NORTH | W_SOUTH | W_EAST | W_WEST
					(or W_ANY) */
{
    xchar sx, sy; /* location of the secret door */
    int count;

    for (count = 0; count < 100; count++) {
	sx = rn1(croom->hx - croom->lx + 1, croom->lx);
	sy = rn1(croom->hy - croom->ly + 1, croom->ly);

	switch(rn2(4)) {
	case 0:  /* top */
	    if (!(walls & W_NORTH)) continue;
	    sy = croom->ly-1; break;
	case 1: /* bottom */
	    if (!(walls & W_SOUTH)) continue;
	    sy = croom->hy+1; break;
	case 2: /* left */
	    if (!(walls & W_EAST)) continue;
	    sx = croom->lx-1; break;
	case 3: /* right */
	    if (!(walls & W_WEST)) continue;
	    sx = croom->hx+1; break;
	}

	if (okdoor(lev, sx, sy)) {
	    lev->locations[sx][sy].typ = SDOOR;
	    lev->locations[sx][sy].doormask = D_CLOSED;
	    add_door(lev, sx, sy, croom);
	    return;
	}
    }

    impossible("couldn't create secret door on any walls 0x%x", walls);
}